

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O1

void __thiscall
leveldb::FilterBlockReader::FilterBlockReader
          (FilterBlockReader *this,FilterPolicy *policy,Slice *contents)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  
  this->policy_ = policy;
  this->data_ = (char *)0x0;
  this->offset_ = (char *)0x0;
  this->num_ = 0;
  this->base_lg_ = 0;
  uVar1 = contents->size_;
  if (4 < uVar1) {
    pcVar2 = contents->data_;
    this->base_lg_ = (long)pcVar2[uVar1 - 1];
    uVar3 = (ulong)*(uint *)(pcVar2 + (uVar1 - 5));
    if (uVar3 <= uVar1 - 5) {
      this->data_ = pcVar2;
      this->offset_ = pcVar2 + uVar3;
      this->num_ = (uVar1 - 5) - uVar3 >> 2;
    }
  }
  return;
}

Assistant:

FilterBlockReader::FilterBlockReader(const FilterPolicy* policy,
                                     const Slice& contents)
    : policy_(policy), data_(nullptr), offset_(nullptr), num_(0), base_lg_(0) {
  size_t n = contents.size();
  if (n < 5) return;  // 1 byte for base_lg_ and 4 for start of offset array
  base_lg_ = contents[n - 1];
  uint32_t last_word = DecodeFixed32(contents.data() + n - 5);
  if (last_word > n - 5) return;
  data_ = contents.data();
  offset_ = data_ + last_word;
  num_ = (n - 5 - last_word) / 4;
}